

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_bandpre.c
# Opt level: O1

int CVBandPrecSetup(sunrealtype t,N_Vector y,N_Vector fy,int jok,int *jcurPtr,sunrealtype gamma,
                   void *bp_data)

{
  long lVar1;
  CVodeMem cv_mem;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  sunrealtype *psVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  char *msgfmt;
  long lVar20;
  long j;
  long lVar21;
  bool bVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double local_c0;
  long local_b8;
  double local_b0;
  long local_a0;
  
  cv_mem = *(CVodeMem *)((long)bp_data + 0x48);
  if (jok == 0) {
    *jcurPtr = 1;
    iVar8 = SUNMatZero(*(undefined8 *)((long)bp_data + 0x18));
    if (iVar8 < 0) {
      msgfmt = "An error arose from a SUNBandMatrix routine.";
      iVar8 = 0x181;
      goto LAB_001105bb;
    }
    if (iVar8 != 0) {
      return 1;
    }
    uVar2 = *(undefined8 *)((long)bp_data + 0x30);
    uVar3 = *(undefined8 *)((long)bp_data + 0x38);
    lVar4 = *(long *)((long)bp_data + 0x48);
    lVar9 = N_VGetArrayPointer(*(undefined8 *)(lVar4 + 200));
    lVar10 = N_VGetArrayPointer(fy);
    lVar11 = N_VGetArrayPointer(uVar2);
    lVar12 = N_VGetArrayPointer(y);
    lVar13 = N_VGetArrayPointer(uVar3);
    if (*(int *)(lVar4 + 0x58) == 0) {
      local_b8 = 0;
    }
    else {
      local_b8 = N_VGetArrayPointer(*(undefined8 *)(lVar4 + 0x108));
    }
    local_b0 = 1.0;
    N_VScale(y,uVar3);
    dVar23 = *(double *)(lVar4 + 8);
    local_c0 = 0.0;
    if (0.0 < dVar23) {
      if (dVar23 < 0.0) {
        local_c0 = sqrt(dVar23);
      }
      else {
        local_c0 = SQRT(dVar23);
      }
    }
    dVar23 = (double)N_VWrmsNorm(fy,*(undefined8 *)(lVar4 + 200));
    if ((dVar23 != 0.0) || (NAN(dVar23))) {
      local_b0 = dVar23 * (double)*bp_data *
                          ABS(*(double *)(lVar4 + 0x140)) * 1000.0 * *(double *)(lVar4 + 8);
    }
    lVar5 = *(long *)((long)bp_data + 8);
    lVar6 = *(long *)((long)bp_data + 0x10);
    lVar21 = lVar6 + lVar5 + 1;
    lVar15 = *bp_data;
    if (lVar21 < *bp_data) {
      lVar15 = lVar21;
    }
    if (0 < lVar15) {
      local_a0 = 0;
      lVar16 = 1;
      do {
        j = lVar16 + -1;
        lVar20 = *bp_data;
        if (lVar16 <= lVar20) {
          iVar8 = *(int *)(lVar4 + 0x58);
          lVar18 = j;
          do {
            dVar23 = *(double *)(lVar12 + lVar18 * 8);
            dVar25 = local_b0 / *(double *)(lVar9 + lVar18 * 8);
            dVar24 = ABS(dVar23) * local_c0;
            if (ABS(dVar23) * local_c0 <= dVar25) {
              dVar24 = dVar25;
            }
            if (iVar8 != 0) {
              dVar25 = *(double *)(local_b8 + lVar18 * 8);
              dVar26 = ABS(dVar25);
              if ((dVar26 != 1.0) || (NAN(dVar26))) {
                if ((dVar26 == 2.0) && ((!NAN(dVar26) && ((dVar23 + dVar24) * dVar25 <= 0.0))))
                goto LAB_00110789;
              }
              else if ((dVar23 + dVar24) * dVar25 < 0.0) {
LAB_00110789:
                dVar24 = -dVar24;
              }
            }
            *(double *)(lVar13 + lVar18 * 8) = dVar24 + *(double *)(lVar13 + lVar18 * 8);
            lVar18 = lVar18 + lVar21;
          } while (lVar18 < lVar20);
        }
        iVar8 = (**(code **)(lVar4 + 0x10))(t,uVar3,uVar2,*(undefined8 *)(lVar4 + 0x18));
        *(long *)((long)bp_data + 0x40) = *(long *)((long)bp_data + 0x40) + 1;
        if (iVar8 != 0) goto LAB_001109a8;
        lVar20 = local_a0;
        if (lVar16 <= *bp_data) {
          do {
            dVar23 = *(double *)(lVar12 + j * 8);
            *(double *)(lVar13 + j * 8) = dVar23;
            psVar14 = SUNBandMatrix_Column(*(SUNMatrix *)((long)bp_data + 0x18),j);
            dVar25 = local_b0 / *(double *)(lVar9 + j * 8);
            dVar24 = ABS(*(double *)(lVar12 + j * 8)) * local_c0;
            if (dVar24 <= dVar25) {
              dVar24 = dVar25;
            }
            if (*(int *)(lVar4 + 0x58) != 0) {
              dVar25 = *(double *)(local_b8 + j * 8);
              dVar26 = ABS(dVar25);
              if ((dVar26 != 1.0) || (NAN(dVar26))) {
                if ((dVar26 == 2.0) && ((!NAN(dVar26) && ((dVar23 + dVar24) * dVar25 <= 0.0)))) {
                  dVar24 = -dVar24;
                }
              }
              else if ((dVar23 + dVar24) * dVar25 < 0.0) {
                dVar24 = -dVar24;
              }
            }
            lVar17 = j - *(long *)((long)bp_data + 0x10);
            lVar18 = 0;
            if (0 < lVar17) {
              lVar18 = lVar17;
            }
            lVar7 = *bp_data;
            lVar19 = *(long *)((long)bp_data + 8) + j;
            lVar1 = lVar7 + -1;
            if (lVar1 <= lVar19) {
              lVar19 = lVar1;
            }
            if (lVar18 <= lVar19) {
              if (lVar17 < 1) {
                lVar17 = 0;
              }
              lVar17 = lVar17 + -1;
              do {
                *(double *)((long)psVar14 + lVar17 * 8 + lVar20 + 8) =
                     (*(double *)(lVar11 + 8 + lVar17 * 8) - *(double *)(lVar10 + 8 + lVar17 * 8)) *
                     (1.0 / dVar24);
                lVar17 = lVar17 + 1;
              } while (lVar17 < lVar19);
            }
            j = j + lVar21;
            lVar20 = lVar20 + ~(lVar5 + lVar6) * 8;
          } while (j < lVar7);
        }
        local_a0 = local_a0 + -8;
        bVar22 = lVar16 != lVar15;
        lVar16 = lVar16 + 1;
      } while (bVar22);
    }
    iVar8 = 0;
LAB_001109a8:
    if (iVar8 < 0) {
      msgfmt = "The right-hand side routine failed in an unrecoverable manner.";
      iVar8 = 0x189;
      goto LAB_001105bb;
    }
    if (iVar8 != 0) {
      return 1;
    }
    iVar8 = SUNMatCopy(*(undefined8 *)((long)bp_data + 0x18),*(undefined8 *)((long)bp_data + 0x20));
    if (iVar8 < 0) {
      msgfmt = "An error arose from a SUNBandMatrix routine.";
      iVar8 = 0x192;
      goto LAB_001105bb;
    }
  }
  else {
    *jcurPtr = 0;
    iVar8 = SUNMatCopy(*(undefined8 *)((long)bp_data + 0x18),*(undefined8 *)((long)bp_data + 0x20));
    if (iVar8 < 0) {
      msgfmt = "An error arose from a SUNBandMatrix routine.";
      iVar8 = 0x175;
      goto LAB_001105bb;
    }
  }
  if (iVar8 != 0) {
    return 1;
  }
  iVar8 = SUNMatScaleAddI(-gamma,*(undefined8 *)((long)bp_data + 0x20));
  if (iVar8 == 0) {
    iVar8 = SUNLinSolSetup_Band(*(SUNLinearSolver *)((long)bp_data + 0x28),
                                *(SUNMatrix *)((long)bp_data + 0x20));
    return iVar8;
  }
  msgfmt = "An error arose from a SUNBandMatrix routine.";
  iVar8 = 0x19c;
LAB_001105bb:
  cvProcessError(cv_mem,-1,iVar8,"CVBandPrecSetup",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_bandpre.c"
                 ,msgfmt);
  return -1;
}

Assistant:

static int CVBandPrecSetup(sunrealtype t, N_Vector y, N_Vector fy,
                           sunbooleantype jok, sunbooleantype* jcurPtr,
                           sunrealtype gamma, void* bp_data)
{
  CVBandPrecData pdata;
  CVodeMem cv_mem;
  int retval;

  /* Assume matrix and lpivots have already been allocated. */
  pdata  = (CVBandPrecData)bp_data;
  cv_mem = (CVodeMem)pdata->cvode_mem;

  if (jok)
  {
    /* If jok = SUNTRUE, use saved copy of J. */
    *jcurPtr = SUNFALSE;
    retval   = SUNMatCopy(pdata->savedJ, pdata->savedP);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSGBP_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }
  }
  else
  {
    /* If jok = SUNFALSE, call CVBandPDQJac for new J value. */
    *jcurPtr = SUNTRUE;
    retval   = SUNMatZero(pdata->savedJ);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSGBP_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }

    retval = CVBandPDQJac(pdata, t, y, fy, pdata->tmp1, pdata->tmp2);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__,
                     MSGBP_RHSFUNC_FAILED);
      return (-1);
    }
    if (retval > 0) { return (1); }

    retval = SUNMatCopy(pdata->savedJ, pdata->savedP);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSGBP_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }
  }

  /* Scale and add identity to get savedP = I - gamma*J. */
  retval = SUNMatScaleAddI(-gamma, pdata->savedP);
  if (retval)
  {
    cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSGBP_SUNMAT_FAIL);
    return (-1);
  }

  /* Do LU factorization of matrix and return error flag */
  retval = SUNLinSolSetup_Band(pdata->LS, pdata->savedP);
  return (retval);
}